

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  _Base_ptr *__k;
  size_t *psVar1;
  key_type *__k_00;
  value_type *__x;
  bool bVar2;
  long lVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  istream *piVar7;
  ostream *poVar8;
  _Rb_tree<std::pair<double,std::__cxx11::string>,std::pair<double,std::__cxx11::string>,std::_Identity<std::pair<double,std::__cxx11::string>>,std::less<std::pair<double,std::__cxx11::string>>,std::allocator<std::pair<double,std::__cxx11::string>>>
  *this;
  mapped_type *b;
  mapped_type *pmVar9;
  iterator iVar10;
  _Base_ptr p_Var11;
  _Self __tmp;
  char *pcVar12;
  int iVar13;
  _Self __tmp_1;
  long lVar14;
  size_t *psVar15;
  double dVar16;
  undefined1 local_220 [8];
  graph_t graph;
  nodes_t nodes;
  node2name_t n2n;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  lengths;
  edges_list_t result;
  string sa2;
  string sa1;
  string n2;
  undefined1 local_e0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  rgraph;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  processed;
  edges_list_t to_visit;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  int local_3c;
  mapped_type mStack_38;
  int count;
  
  sa2.field_2._8_8_ = &sa1._M_string_length;
  sa1._M_dataplus._M_p = (pointer)0x0;
  sa1._M_string_length._0_1_ = 0;
  result.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)&sa2._M_string_length;
  sa2._M_dataplus._M_p = (pointer)0x0;
  sa2._M_string_length._0_1_ = 0;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)(sa2.field_2._M_local_buf + 8));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,
             (string *)
             &result.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size);
  std::istream::operator>>((istream *)&std::cin,&local_3c);
  std::istream::ignore();
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&nodes;
  nodes._M_t._M_impl._0_4_ = 0;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&n2n;
  n2n._M_t._M_impl._0_4_ = 0;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&graph;
  graph._M_t._M_impl._0_4_ = 0;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&lengths;
  lengths._M_t._M_impl._0_4_ = 0;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  dVar16 = 0.0;
  psVar1 = &rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    if (local_3c <= SUB84(dVar16,0)) {
      std::istream::operator>>((istream *)&std::cin,&local_3c);
      std::istream::ignore();
      rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&rgraph;
      rgraph._M_t._M_impl._0_8_ = rgraph._M_t._M_impl._0_8_ & 0xffffffff00000000;
      rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      rgraph._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      __k_00 = (key_type *)(sa1.field_2._M_local_buf + 8);
      rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      for (iVar13 = 0; iVar13 < local_3c; iVar13 = iVar13 + 1) {
        local_60 = (undefined1  [8])
                   &parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        sa1.field_2._8_8_ = &n2._M_string_length;
        n2._M_dataplus._M_p = (pointer)0x0;
        n2._M_string_length._0_1_ = 0;
        piVar7 = std::operator>>((istream *)&std::cin,(string *)local_60);
        std::operator>>(piVar7,(string *)__k_00);
        std::istream::ignore();
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60,"StopArea:AMER");
        if (bVar2) {
          poVar8 = std::operator<<((ostream *)&std::cerr,(string *)local_60);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,(string *)__k_00);
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        this = (_Rb_tree<std::pair<double,std::__cxx11::string>,std::pair<double,std::__cxx11::string>,std::_Identity<std::pair<double,std::__cxx11::string>>,std::less<std::pair<double,std::__cxx11::string>>,std::allocator<std::pair<double,std::__cxx11::string>>>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                *)local_220,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_60);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                               *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60);
        b = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                          *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count,__k_00);
        rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)_distance(pmVar5,b);
        std::__cxx11::string::string((string *)&processed,(string *)__k_00);
        std::
        _Rb_tree<std::pair<double,std::__cxx11::string>,std::pair<double,std::__cxx11::string>,std::_Identity<std::pair<double,std::__cxx11::string>>,std::less<std::pair<double,std::__cxx11::string>>,std::allocator<std::pair<double,std::__cxx11::string>>>
        ::_M_insert_unique<std::pair<double,std::__cxx11::string>>
                  (this,(pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string((string *)&processed);
        std::__cxx11::string::~string((string *)__k_00);
        std::__cxx11::string::~string((string *)local_60);
      }
      processed._M_t._M_impl._0_4_ = 0;
      processed._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      processed._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      processed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&processed;
      processed._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      processed._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)&processed._M_t._M_impl.super__Rb_tree_header._M_node_count;
      processed._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           processed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)processed._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  (value_type *)((long)&sa2.field_2 + 8));
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&sa2.field_2 + 8));
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                             *)&n2n._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)((long)&sa2.field_2 + 8));
      *pmVar6 = 0.0;
      psVar1 = &n2n._M_t._M_impl.super__Rb_tree_header._M_node_count;
      while ((size_t *)processed._M_t._M_impl.super__Rb_tree_header._M_node_count !=
             &processed._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        std::__cxx11::string::string
                  ((string *)local_60,
                   (string *)(processed._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
        psVar15 = &processed._M_t._M_impl.super__Rb_tree_header._M_node_count;
        while (psVar15 = (size_t *)*psVar15,
              psVar15 != &processed._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)psVar1,(key_type *)local_60);
          mStack_38 = *pmVar6;
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)psVar1,(key_type *)(psVar15 + 2));
          if (*pmVar6 <= mStack_38 && mStack_38 != *pmVar6) {
            std::__cxx11::string::_M_assign((string *)local_60);
          }
        }
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::remove((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&processed._M_t._M_impl.super__Rb_tree_header._M_node_count,(char *)local_60);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                               *)psVar1,(key_type *)local_60);
        iVar13 = main::C;
        dVar16 = *pmVar6;
        main::C = main::C + 1;
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar13);
        poVar8 = std::operator<<(poVar8,". check node ");
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (key_type *)local_60);
        poVar8 = std::operator<<(poVar8,(string *)pmVar4);
        std::operator<<(poVar8,": ");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                               *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (key_type *)local_60);
        poVar8 = std::ostream::_M_insert<double>(pmVar5->first);
        std::operator<<(poVar8,", ");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                               *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (key_type *)local_60);
        poVar8 = std::ostream::_M_insert<double>(pmVar5->second);
        std::endl<char,std::char_traits<char>>(poVar8);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                               *)local_220,(key_type *)local_60);
        p_Var11 = (pmVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                 *)local_220,(key_type *)local_60);
          if ((_Rb_tree_header *)p_Var11 == &(pmVar9->_M_t)._M_impl.super__Rb_tree_header) break;
          __k = &p_Var11[1]._M_parent;
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (key_type *)__k);
          if ((_Base_ptr)&processed == iVar10._M_node) {
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&processed._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (value_type *)__k);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          }
          mStack_38 = *(mapped_type *)(p_Var11 + 1);
          std::operator<<((ostream *)&std::cerr,"w = ");
          poVar8 = std::ostream::_M_insert<double>(dVar16);
          std::operator<<(poVar8,"\td = ");
          poVar8 = std::ostream::_M_insert<double>(mStack_38);
          poVar8 = std::operator<<(poVar8,"\tcurrent (");
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (key_type *)__k);
          poVar8 = std::operator<<(poVar8,(string *)pmVar4);
          std::operator<<(poVar8,"): ");
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)psVar1,(key_type *)__k);
          poVar8 = std::ostream::_M_insert<double>(*pmVar6);
          std::endl<char,std::char_traits<char>>(poVar8);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)psVar1,(key_type *)__k);
          if ((*pmVar6 != -1.0) || (NAN(*pmVar6))) {
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                   *)psVar1,(key_type *)__k);
            pcVar12 = "skip";
            if (dVar16 + mStack_38 < *pmVar6) goto LAB_00108cf2;
          }
          else {
LAB_00108cf2:
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                   *)psVar1,(key_type *)__k);
            *pmVar6 = mStack_38 + dVar16;
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_e0,(key_type *)__k);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            pcVar12 = "update path";
          }
          poVar8 = std::operator<<((ostream *)&std::cerr,pcVar12);
          std::endl<char,std::char_traits<char>>(poVar8);
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        }
        std::__cxx11::string::~string((string *)local_60);
      }
      for (p_Var11 = lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var11 != (_Rb_tree_node_base *)&lengths;
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (key_type *)(p_Var11 + 1));
        poVar8 = std::operator<<((ostream *)&std::cerr,(string *)pmVar4);
        std::operator<<(poVar8,": ");
        poVar8 = std::ostream::_M_insert<double>(*(double *)(p_Var11 + 2));
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                             *)&n2n._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)
                            &result.
                             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl._M_node._M_size);
      if ((*pmVar6 != -1.0) || (NAN(*pmVar6))) {
        lengths._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)&lengths._M_t._M_impl.super__Rb_tree_header._M_node_count;
        result.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
        result.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next =
             (_List_node_base *)lengths._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::__cxx11::string::string
                  ((string *)local_60,
                   (string *)
                   &result.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&lengths._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (value_type *)
                     &result.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl._M_node._M_size);
        __x = (value_type *)(sa1.field_2._M_local_buf + 8);
        psVar1 = &lengths._M_t._M_impl.super__Rb_tree_header._M_node_count;
        while( true ) {
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&sa2.field_2 + 8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_60);
          if (!bVar2) break;
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_e0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60);
          std::__cxx11::string::string((string *)__x,(string *)pmVar4);
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)psVar1,__x);
          std::__cxx11::string::_M_assign((string *)local_60);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,__x);
          poVar8 = std::operator<<((ostream *)&std::cerr,(string *)pmVar4);
          poVar8 = std::operator<<(poVar8,":\t");
          poVar8 = std::operator<<(poVar8,(string *)__x);
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__cxx11::string::~string((string *)__x);
        }
        psVar15 = psVar1;
        while (psVar15 = (size_t *)*psVar15, psVar15 != psVar1) {
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (key_type *)(psVar15 + 2));
          poVar8 = std::operator<<((ostream *)&std::cout,(string *)pmVar4);
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        std::__cxx11::string::~string((string *)local_60);
        std::__cxx11::
        _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&lengths._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cout,"IMPOSSIBLE");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&processed._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_e0);
      iVar13 = 0;
LAB_0010882d:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   *)&n2n._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   *)local_220);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                   *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string
                ((string *)
                 &result.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size);
      std::__cxx11::string::~string((string *)(sa2.field_2._M_local_buf + 8));
      return iVar13;
    }
    rgraph._M_t._M_impl._0_8_ = 0;
    rgraph._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         rgraph._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
    local_e0 = (undefined1  [8])&rgraph._M_t._M_impl.super__Rb_tree_header;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_e0);
    mStack_38 = dVar16;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,9,(allocator_type *)psVar1);
    for (lVar14 = 0; lVar14 != 0x100; lVar14 = lVar14 + 0x20) {
      lVar3 = std::__cxx11::string::find((char)(string *)local_e0,0x2c);
      if (lVar3 == -1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60);
        std::__cxx11::string::~string((string *)local_e0);
        iVar13 = -1;
        goto LAB_0010882d;
      }
      std::__cxx11::string::substr((ulong)psVar1,(ulong)local_e0);
      std::__cxx11::string::operator=((string *)((long)local_60 + lVar14),(string *)psVar1);
      std::__cxx11::string::~string((string *)psVar1);
      std::__cxx11::string::substr((ulong)psVar1,(ulong)local_e0);
      std::__cxx11::string::operator=((string *)local_e0,(string *)psVar1);
      std::__cxx11::string::~string((string *)psVar1);
    }
    std::__cxx11::string::_M_assign((string *)((long)local_60 + 0x100));
    unquote((string *)((long)local_60 + 0x20));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (key_type *)local_60);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    dVar16 = get_number((string *)((long)local_60 + 0x60));
    n2.field_2._8_8_ = get_number((string *)((long)local_60 + 0x80));
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                           *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (key_type *)local_60);
    pmVar5->first = dVar16;
    pmVar5->second = (double)n2.field_2._8_8_;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  *)local_220,(key_type *)local_60);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                           *)&n2n._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (key_type *)local_60);
    *pmVar6 = -1.0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
    std::__cxx11::string::~string((string *)local_e0);
    dVar16 = (double)(ulong)(SUB84(mStack_38,0) + 1);
  } while( true );
}

Assistant:

int main()
{
        std::string sa1, sa2;
        getline(std::cin, sa1);
        getline(std::cin, sa2);
        int count;
        std::cin >> count;
        std::cin.ignore();

        // Read nodes
        typedef std::map<std::string, std::pair<double, double> > nodes_t;
        typedef std::map<std::string, std::string> node2name_t;

        nodes_t nodes;
        node2name_t n2n;

        graph_t graph;
        std::map<std::string, double> lengths;
        for (int i = 0; i < count; i++)
        {
            std::string line;
            getline(std::cin, line);

            std::vector<std::string> parts(9);
            for (int i = 0; i < 9 - 1; i++)
            {
                size_t pos = line.find(',');
                if (pos == std::string::npos)
                {
                    //std::cout << "Invalid format: " << line << std::endl;
                    return -1;
                }
                parts[i] = line.substr(0, pos);
                line = line.substr(pos + 1);
                //std::cerr << "Part #" << i << ": " << parts[i] << std::endl;
            }
            parts[8] = line;
            unquote(parts[1]);
            n2n[parts[0]] = parts[1];
            nodes[parts[0]] = nodes_t::mapped_type(get_number(parts[3]), get_number(parts[4]));
            graph[parts[0]];
            lengths[parts[0]] = -1.0;
            //cerr << parts[1] << ": " << get_number(parts[3]) << ", " << get_number(parts[4]) << endl;
            //std::cerr << parts[0] << ": " << nodes[parts[0]].first << ", " << nodes[parts[0]].second << std::endl;
        }

        // Read edges
        std::cin >> count;
        std::cin.ignore();
        std::map<std::string, std::string> rgraph;
        for (int i = 0; i < count; i++)
        {
            std::string n1, n2;
            std::cin >> n1 >> n2;
            std::cin.ignore();
            if (n1 == "StopArea:AMER")
            {
                std::cerr << n1 << " " << n2 << std::endl;
            }
            graph[n1].insert(std::pair<double, edge_t>(_distance(nodes[n1], nodes[n2]), n2));
        }

        std::set<std::string> processed;
        edges_list_t to_visit;
        to_visit.push_back(sa1);
        processed.insert(sa1);
        lengths[sa1] = 0.0;
        while (!to_visit.empty())
        {
            std::string e = to_visit.front();
            for (edges_list_t::const_iterator i = to_visit.begin(); i != to_visit.end(); i++)
            {
                if (lengths[e] > lengths[*i])
                {
                    e = *i;
                }
            }
            to_visit.remove(e);
            double w = lengths[e];
            static int C = 1;
            std::cerr << C++ << ". check node " << n2n[e] << ": " << nodes[e].first << ", " << nodes[e].second << std::endl;
            for (edges_set_t::const_iterator i = graph[e].begin(); i != graph[e].end(); i++)
            {
                if (processed.end() == processed.find(i->second))
                {
                    to_visit.push_back(i->second);
                    processed.insert(i->second);
                }
                double d = i->first;
                std::cerr << "w = " << w << "\td = " << d << "\tcurrent (" << n2n[i->second] << "): " << lengths[i->second] << std::endl;
                if (-1.0 == lengths[i->second]
                    || w + d < lengths[i->second])
                {
                    lengths[i->second] = w + d;
                    rgraph[i->second] = e;
                    std::cerr << "update path" << std::endl;
                } else
                {
                    std::cerr << "skip" << std::endl;
                }
            }
        }

        for (std::map<std::string, double>::const_iterator i = lengths.begin(); i != lengths.end(); i++)
        {
            std::cerr << n2n[i->first] << ": " << i->second << std::endl;
        }

        // Build path
        if (-1.0 == lengths[sa2])
        {
            std::cout << "IMPOSSIBLE" << std::endl;
        } else
        {
            edges_list_t result;
            std::string n = sa2;
            result.push_front(sa2);
            while (sa1 != n)
            {
                std::string nmin = rgraph[n];
                result.push_front(nmin);
                n = nmin;
                std::cerr << n2n[nmin] << ":\t" << nmin << std::endl;
            }

            for (edges_list_t::const_iterator i = result.begin(); i != result.end(); i++)
            {
                std::cout << n2n[*i] << std::endl;
            }
        }

        return 0;
}